

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_C0001_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_C0001_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  value_view v_01;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  key_view akey;
  key_view akey_00;
  key_view akey_01;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  iterator b;
  TypeParam *db;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  bool in_stack_fffffffffffff61f;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff620;
  string local_9c0;
  AssertHelper local_9a0;
  Message local_998;
  bool local_989;
  AssertionResult local_988;
  string local_978;
  AssertHelper local_958;
  Message local_950 [2];
  undefined1 local_940 [23];
  bool local_929;
  AssertionResult local_928;
  AssertHelper local_918;
  Message local_910;
  int local_904;
  key_view local_900;
  _Map_pointer local_8f0;
  AssertionResult local_8e8;
  string local_8d8;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  AssertionResult local_8a0;
  string local_890;
  AssertHelper local_870;
  Message local_868 [2];
  undefined1 local_858 [23];
  bool local_841;
  AssertionResult local_840;
  AssertHelper local_830;
  Message local_828;
  int local_81c;
  key_view local_818;
  _Map_pointer local_808;
  AssertionResult local_800;
  string local_7f0;
  AssertHelper local_7d0;
  Message local_7c8;
  bool local_7b9;
  AssertionResult local_7b8;
  string local_7a8;
  AssertHelper local_788;
  Message local_780 [2];
  undefined1 local_770 [23];
  bool local_759;
  AssertionResult local_758;
  AssertHelper local_748;
  Message local_740;
  int local_734;
  key_view local_730;
  _Map_pointer local_720;
  AssertionResult local_718;
  string local_708;
  AssertHelper local_6e8;
  Message local_6e0;
  bool local_6d1;
  AssertionResult local_6d0;
  iterator local_6c0;
  pointer local_550;
  size_t sStack_548;
  pointer local_540;
  size_t sStack_538;
  pointer local_520;
  size_t sStack_518;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_508;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffff620,in_stack_fffffffffffff61f);
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_520 = pvVar2->_M_ptr;
  sStack_518 = (pvVar2->_M_extent)._M_extent_value;
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0xaa00,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_540 = pvVar2->_M_ptr;
  sStack_538 = (pvVar2->_M_extent)._M_extent_value;
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0xaa01,v_00,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_550 = pvVar2->_M_ptr;
  sStack_548 = (pvVar2->_M_extent)._M_extent_value;
  v_01._M_ptr = pvVar2->_M_ptr;
  v_01._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0xab00,v_01,false);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator(&local_6c0,local_508);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::first(&local_6c0);
  local_6d1 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_6c0);
  testing::AssertionResult::AssertionResult<bool>(&local_6d0,&local_6d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_708,(internal *)&local_6d0,(AssertionResult *)"b.valid()","false","true",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_708);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult(&local_6d0);
  local_730 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key(&local_6c0);
  akey._M_extent = local_730._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_720 = (_Map_pointer)decode((anon_unknown_dwarf_d5c8 *)local_730._M_ptr,akey);
  local_734 = 0xaa00;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)&local_718,"(decode(b.get_key()))","(0xaa00)",(unsigned_long *)&local_720,
             &local_734);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_718);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar3 = testing::AssertionResult::failure_message(&local_718);
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=(&local_748,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult(&local_718);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_770);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_759 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_770,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_758,&local_759,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_770)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_758);
  if (!bVar1) {
    testing::Message::Message(local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7a8,(internal *)&local_758,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_7a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=(&local_788,local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    std::__cxx11::string::~string((string *)&local_7a8);
    testing::Message::~Message(local_780);
  }
  testing::AssertionResult::~AssertionResult(&local_758);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(&local_6c0);
  local_7b9 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_6c0);
  testing::AssertionResult::AssertionResult<bool>(&local_7b8,&local_7b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_7c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7f0,(internal *)&local_7b8,(AssertionResult *)"b.valid()","false","true",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_7f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    std::__cxx11::string::~string((string *)&local_7f0);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult(&local_7b8);
  local_818 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key(&local_6c0);
  akey_00._M_extent = local_818._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_808 = (_Map_pointer)decode((anon_unknown_dwarf_d5c8 *)local_818._M_ptr,akey_00);
  local_81c = 0xaa01;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)&local_800,"(decode(b.get_key()))","(0xaa01)",(unsigned_long *)&local_808,
             &local_81c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_800);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    pcVar3 = testing::AssertionResult::failure_message(&local_800);
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_830,&local_828);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult(&local_800);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_858);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_841 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_858,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_840,&local_841,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_858)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_840);
  if (!bVar1) {
    testing::Message::Message(local_868);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_890,(internal *)&local_840,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_890);
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_870,local_868);
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    std::__cxx11::string::~string((string *)&local_890);
    testing::Message::~Message(local_868);
  }
  testing::AssertionResult::~AssertionResult(&local_840);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(&local_6c0);
  local_8a1 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_6c0);
  testing::AssertionResult::AssertionResult<bool>(&local_8a0,&local_8a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8d8,(internal *)&local_8a0,(AssertionResult *)"b.valid()","false","true",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_8d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult(&local_8a0);
  local_900 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key(&local_6c0);
  akey_01._M_extent = local_900._M_extent._M_extent_value;
  akey_01._M_ptr = (pointer)akey_01._M_extent._M_extent_value;
  local_8f0 = (_Map_pointer)decode((anon_unknown_dwarf_d5c8 *)local_900._M_ptr,akey_01);
  local_904 = 0xab00;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)&local_8e8,"(decode(b.get_key()))","(0xab00)",(unsigned_long *)&local_8f0,
             &local_904);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    pcVar3 = testing::AssertionResult::failure_message(&local_8e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_918,&local_910);
    testing::internal::AssertHelper::~AssertHelper(&local_918);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult(&local_8e8);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_940);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_929 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_940,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_928,&local_929,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_940)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_928);
  if (!bVar1) {
    testing::Message::Message(local_950);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_978,(internal *)&local_928,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_978);
    testing::internal::AssertHelper::AssertHelper
              (&local_958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_958,local_950);
    testing::internal::AssertHelper::~AssertHelper(&local_958);
    std::__cxx11::string::~string((string *)&local_978);
    testing::Message::~Message(local_950);
  }
  testing::AssertionResult::~AssertionResult(&local_928);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(&local_6c0);
  local_989 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_6c0);
  local_989 = !local_989;
  testing::AssertionResult::AssertionResult<bool>(&local_988,&local_989,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_988);
  if (!bVar1) {
    testing::Message::Message(&local_998);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_9c0,(internal *)&local_988,(AssertionResult *)"b.valid()","true","false",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_9c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0xa5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9a0,&local_998);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    std::__cxx11::string::~string((string *)&local_9c0);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult(&local_988);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator(&local_6c0);
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, C0001) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0xaa00, unodb::test::test_values[0]);
  verifier.insert(0xaa01, unodb::test::test_values[1]);
  verifier.insert(0xab00, unodb::test::test_values[2]);
  auto b = db.test_only_iterator();
  b.first();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0xaa00);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.next();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0xaa01);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.next();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0xab00);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[2]));
  }
  b.next();
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}